

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O2

ON_RevSurface * __thiscall
ON_Sphere::RevSurfaceForm(ON_Sphere *this,bool bArcLengthParameterization,ON_RevSurface *srf)

{
  ON_3dVector *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  ON_ArcCurve *this_01;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Arc *pOVar6;
  byte bVar7;
  ulong uVar8;
  ON_3dVector local_f0;
  double local_d8;
  undefined8 uStack_d0;
  ON_Arc arc;
  
  bVar7 = 0;
  if (srf != (ON_RevSurface *)0x0) {
    ON_RevSurface::Destroy(srf);
  }
  bVar3 = IsValid(this);
  if (bVar3) {
    pOVar5 = &ON_Plane::World_xy;
    pOVar6 = &arc;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pOVar6->super_ON_Circle).plane.origin.x = (pOVar5->origin).x;
      pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Arc *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    arc.super_ON_Circle.radius = 1.0;
    arc.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
    arc.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
    arc.super_ON_Circle.plane.origin.x = (this->plane).origin.x;
    arc.super_ON_Circle.plane.origin.y = (this->plane).origin.y;
    arc.super_ON_Circle.plane.origin.z = (this->plane).origin.z;
    this_00 = &(this->plane).zaxis;
    ON_3dVector::operator-(&local_f0,this_00);
    arc.super_ON_Circle.plane.xaxis.z = local_f0.z;
    arc.super_ON_Circle.plane.xaxis.x = local_f0.x;
    arc.super_ON_Circle.plane.xaxis.y = local_f0.y;
    arc.super_ON_Circle.plane.yaxis.x = (this->plane).xaxis.x;
    arc.super_ON_Circle.plane.yaxis.y = (this->plane).xaxis.y;
    arc.super_ON_Circle.plane.yaxis.z = (this->plane).xaxis.z;
    ON_3dVector::operator-(&local_f0,&(this->plane).yaxis);
    arc.super_ON_Circle.plane.zaxis.z = local_f0.z;
    arc.super_ON_Circle.plane.zaxis.x = local_f0.x;
    arc.super_ON_Circle.plane.zaxis.y = local_f0.y;
    ON_Plane::UpdateEquation((ON_Plane *)&arc);
    arc.super_ON_Circle.radius = this->radius;
    ON_Arc::SetAngleRadians(&arc,3.141592653589793);
    this_01 = (ON_ArcCurve *)operator_new(0xc0);
    ON_ArcCurve::ON_ArcCurve(this_01,&arc,-1.5707963267948966,1.5707963267948966);
    if (srf == (ON_RevSurface *)0x0) {
      srf = (ON_RevSurface *)operator_new(0xa0);
      ON_RevSurface::ON_RevSurface(srf);
    }
    ON_Interval::Set(&srf->m_angle,0.0,6.283185307179586);
    dVar1 = (srf->m_angle).m_t[1];
    (srf->m_t).m_t[0] = (srf->m_angle).m_t[0];
    (srf->m_t).m_t[1] = dVar1;
    srf->m_curve = (ON_Curve *)this_01;
    dVar1 = (this->plane).origin.y;
    (srf->m_axis).from.x = (this->plane).origin.x;
    (srf->m_axis).from.y = dVar1;
    (srf->m_axis).from.z = (this->plane).origin.z;
    ON_3dPoint::operator+((ON_3dPoint *)&local_f0,(ON_3dPoint *)this,this_00);
    (srf->m_axis).to.z = local_f0.z;
    (srf->m_axis).to.x = local_f0.x;
    (srf->m_axis).to.y = local_f0.y;
    srf->m_bTransposed = false;
    (srf->m_bbox).m_min.z = (this->plane).origin.z;
    dVar1 = (this->plane).origin.y;
    (srf->m_bbox).m_min.x = (this->plane).origin.x;
    (srf->m_bbox).m_min.y = dVar1;
    dVar1 = this->radius;
    dVar2 = (srf->m_bbox).m_min.y;
    (srf->m_bbox).m_min.x = (srf->m_bbox).m_min.x - dVar1;
    (srf->m_bbox).m_min.y = dVar2 - dVar1;
    (srf->m_bbox).m_min.z = (srf->m_bbox).m_min.z - dVar1;
    (srf->m_bbox).m_max.z = (this->plane).origin.z;
    dVar1 = (this->plane).origin.y;
    (srf->m_bbox).m_max.x = (this->plane).origin.x;
    (srf->m_bbox).m_max.y = dVar1;
    dVar1 = this->radius;
    dVar2 = (srf->m_bbox).m_max.y;
    (srf->m_bbox).m_max.x = dVar1 + (srf->m_bbox).m_max.x;
    (srf->m_bbox).m_max.y = dVar1 + dVar2;
    (srf->m_bbox).m_max.z = (srf->m_bbox).m_max.z + dVar1;
    if (bArcLengthParameterization) {
      uVar8 = -(ulong)(1.490116119385e-08 < ABS(dVar1));
      local_d8 = (double)(~uVar8 & 0x400921fb54442d18 |
                         (ulong)(ABS(dVar1) * 3.141592653589793) & uVar8);
      uStack_d0 = 0;
      (*(srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                (0,local_d8 + local_d8,srf,0);
      (*(srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                (SUB84(local_d8 * -0.5,0),local_d8 * 0.5,srf,1);
    }
    ON_Plane::~ON_Plane((ON_Plane *)&arc);
  }
  else {
    srf = (ON_RevSurface *)0x0;
  }
  return srf;
}

Assistant:

ON_RevSurface* ON_Sphere::RevSurfaceForm( 
  bool bArcLengthParameterization,
  ON_RevSurface* srf 
  ) const
{
  if ( srf )
    srf->Destroy();
  ON_RevSurface* pRevSurface = nullptr;
  if ( IsValid() )
  {
    ON_Arc arc;
    arc.plane.origin = plane.origin;
    arc.plane.xaxis = -plane.zaxis;
    arc.plane.yaxis =  plane.xaxis;
    arc.plane.zaxis = -plane.yaxis;
    arc.plane.UpdateEquation();
    arc.radius = radius;
    arc.SetAngleRadians(ON_PI);
    ON_ArcCurve* arc_curve = new ON_ArcCurve( arc, -0.5*ON_PI, 0.5*ON_PI );
    if ( srf )
      pRevSurface = srf;
    else
      pRevSurface = new ON_RevSurface();
    pRevSurface->m_angle.Set(0.0,2.0*ON_PI);
    pRevSurface->m_t = pRevSurface->m_angle;
    pRevSurface->m_curve = arc_curve;
    pRevSurface->m_axis.from = plane.origin;
    pRevSurface->m_axis.to = plane.origin + plane.zaxis;
    pRevSurface->m_bTransposed = false;
    pRevSurface->m_bbox.m_min = plane.origin;
    pRevSurface->m_bbox.m_min.x -= radius;
    pRevSurface->m_bbox.m_min.y -= radius;
    pRevSurface->m_bbox.m_min.z -= radius;
    pRevSurface->m_bbox.m_max = plane.origin;
    pRevSurface->m_bbox.m_max.x += radius;
    pRevSurface->m_bbox.m_max.y += radius;
    pRevSurface->m_bbox.m_max.z += radius;
    if ( bArcLengthParameterization )
    {
      double r = fabs(radius);
      if ( !(r > ON_SQRT_EPSILON) )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(0,0.0,2.0*r);
      pRevSurface->SetDomain(1,-0.5*r,0.5*r);
    }
  }
  return pRevSurface;
}